

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_scroller.c
# Opt level: O3

void draw_background(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = al_get_bitmap_width(tile);
  iVar2 = al_get_bitmap_height(tile);
  for (; iVar6 = offy, 0 < offx; offx = offx - iVar1) {
  }
  for (; 0 < iVar6; iVar6 = iVar6 - iVar2) {
  }
  iVar3 = screen_height;
  offy = iVar6;
  iVar4 = screen_width;
  if (iVar6 < screen_height) {
    do {
      if (offx < iVar4) {
        iVar5 = offx;
        do {
          al_draw_bitmap((float)iVar5,(float)iVar6,tile,0);
          iVar5 = iVar5 + iVar1;
          iVar3 = screen_height;
          iVar4 = screen_width;
        } while (iVar5 < screen_width);
      }
      iVar6 = iVar6 + iVar2;
    } while (iVar6 < iVar3);
  }
  return;
}

Assistant:

void draw_background(void)
{
   int dx = al_get_bitmap_width(tile);
   int dy = al_get_bitmap_height(tile);
   int x, y;

   while (offx > 0)
      offx -= dx;
   while (offy > 0)
      offy -= dy;

   for (y = offy; y < screen_height; y += dy) {
      for (x = offx; x < screen_width; x += dx) {
         al_draw_bitmap(tile, x, y, 0);
      }
   }
}